

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_negative_positive_transpose
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
           *this,Index columnIndex)

{
  value_type vVar1;
  Index IVar2;
  Pos_index PVar3;
  uint uVar4;
  Master_RU_matrix *pMVar5;
  reference pvVar6;
  Pos_index *pPVar7;
  mapped_type *__a;
  mapped_type *__b;
  key_type local_18;
  Index local_14;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *pRStack_10;
  Index columnIndex_local;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *this_local;
  
  local_14 = columnIndex;
  pRStack_10 = this;
  pMVar5 = _matrix(this);
  PVar3 = _get_birth(this,local_14);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&pMVar5->pivotToColumnIndex_,(ulong)PVar3);
  *pvVar6 = columnIndex + 1;
  pMVar5 = _matrix(this);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&pMVar5->pivotToColumnIndex_,(ulong)(local_14 + 1));
  vVar1 = *pvVar6;
  pMVar5 = _matrix(this);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&pMVar5->pivotToColumnIndex_,(ulong)local_14);
  *pvVar6 = vVar1;
  uVar4 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>
          ::get_null_value<unsigned_int>();
  pMVar5 = _matrix(this);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&pMVar5->pivotToColumnIndex_,(ulong)(local_14 + 1));
  *pvVar6 = uVar4;
  PVar3 = local_14 + 1;
  pPVar7 = _death(this,local_14);
  IVar2 = local_14;
  *pPVar7 = PVar3;
  pPVar7 = _birth(this,local_14 + 1);
  *pPVar7 = IVar2;
  __a = std::
        unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
        ::at(&(this->super_type).indexToBar_,&local_14);
  local_18 = local_14 + 1;
  __b = std::
        unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
        ::at(&(this->super_type).indexToBar_,&local_18);
  std::swap<std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
            (__a,__b);
  return;
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_negative_positive_transpose(Index columnIndex) 
{
  _matrix()->pivotToColumnIndex_.at(_get_birth(columnIndex)) = columnIndex + 1;
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if (_is_paired(columnIndex + 1)) {
      _matrix()->pivotToColumnIndex_.emplace(columnIndex, _matrix()->pivotToColumnIndex_.at(columnIndex + 1));
      _matrix()->pivotToColumnIndex_.erase(columnIndex + 1);
    }
  } else {
    _matrix()->pivotToColumnIndex_[columnIndex] = _matrix()->pivotToColumnIndex_[columnIndex + 1];
    _matrix()->pivotToColumnIndex_[columnIndex + 1] = Master_matrix::template get_null_value<Index>();
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _death(columnIndex) = columnIndex + 1;
    _birth(columnIndex + 1) = columnIndex;
    std::swap(RUP::indexToBar_.at(columnIndex), RUP::indexToBar_.at(columnIndex + 1));
  }
}